

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall cmake::CheckBuildSystem(cmake *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  cmGlobalGenerator *globalGenerator;
  undefined4 extraout_var;
  char *__s;
  uint uVar7;
  string *psVar8;
  string *psVar9;
  bool bVar10;
  int result_1;
  string dep_newest;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputs;
  int result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string out_oldest;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  products;
  ostringstream msg_2;
  cmMakefile mf;
  cmake cm;
  cmGlobalGenerator gg;
  long *plVar6;
  
  bVar1 = isCMakeVerbose();
  if ((this->CheckBuildSystemArgument)._M_string_length == 0) {
    if (!bVar1) {
      return 1;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&mf);
    std::operator<<((ostream *)&mf,"Re-run cmake no build system arguments\n");
    std::__cxx11::stringbuf::str();
    cmSystemTools::Stdout((string *)&msg_2);
  }
  else {
    psVar9 = &this->CheckBuildSystemArgument;
    bVar2 = cmsys::SystemTools::FileExists(psVar9);
    if (bVar2) {
      uVar7 = 1;
      cmake(&cm,RoleScript,Unknown);
      std::__cxx11::string::string<std::allocator<char>>((string *)&mf,"",(allocator<char> *)&msg_2)
      ;
      SetHomeDirectory(&cm,(string *)&mf);
      std::__cxx11::string::~string((string *)&mf);
      std::__cxx11::string::string<std::allocator<char>>((string *)&mf,"",(allocator<char> *)&msg_2)
      ;
      SetHomeOutputDirectory(&cm,(string *)&mf);
      std::__cxx11::string::~string((string *)&mf);
      mf.FindPackageRootPathStack.
      super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur =
           (_Elt_pointer)cm.CurrentSnapshot.Position.Position;
      mf.FindPackageRootPathStack.
      super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)cm.CurrentSnapshot.State;
      mf.FindPackageRootPathStack.
      super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map_size = (size_t)cm.CurrentSnapshot.Position.Tree;
      cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&mf);
      cmGlobalGenerator::cmGlobalGenerator(&gg,&cm);
      _msg_2 = (pointer)cm.CurrentSnapshot.State;
      cmMakefile::cmMakefile(&mf,&gg,(cmStateSnapshot *)&msg_2);
      bVar2 = cmMakefile::ReadListFile(&mf,psVar9);
      if ((!bVar2) || (bVar2 = cmSystemTools::GetErrorOccuredFlag(), bVar2)) {
        if (bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg_2);
          poVar4 = std::operator<<((ostream *)&msg_2,"Re-run cmake error reading : ");
          poVar4 = std::operator<<(poVar4,(string *)psVar9);
          std::operator<<(poVar4,"\n");
          std::__cxx11::stringbuf::str();
          cmSystemTools::Stdout(&dep_newest);
          std::__cxx11::string::~string((string *)&dep_newest);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg_2);
        }
      }
      else {
        if (this->ClearBuildSystem == true) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&msg_2,"CMAKE_DEPENDS_GENERATOR",(allocator<char> *)&dep_newest);
          pcVar5 = cmMakefile::GetDefinition(&mf,(string *)&msg_2);
          std::__cxx11::string::~string((string *)&msg_2);
          if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
            pcVar5 = "Unix Makefiles";
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&msg_2,pcVar5,(allocator<char> *)&dep_newest);
          globalGenerator = CreateGlobalGenerator(this,(string *)&msg_2);
          std::__cxx11::string::~string((string *)&msg_2);
          if (globalGenerator != (cmGlobalGenerator *)0x0) {
            _msg_2 = (pointer)cm.CurrentSnapshot.State;
            cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&msg_2);
            dep_newest.field_2._M_allocated_capacity = cm.CurrentSnapshot.Position.Position;
            dep_newest._M_dataplus._M_p = (pointer)cm.CurrentSnapshot.State;
            dep_newest._M_string_length = (size_type)cm.CurrentSnapshot.Position.Tree;
            cmMakefile::cmMakefile
                      ((cmMakefile *)&msg_2,globalGenerator,(cmStateSnapshot *)&dep_newest);
            iVar3 = (*globalGenerator->_vptr_cmGlobalGenerator[2])(globalGenerator,&msg_2);
            plVar6 = (long *)CONCAT44(extraout_var,iVar3);
            (**(code **)(*plVar6 + 0x50))(plVar6,&msg_2,bVar1);
            (**(code **)(*plVar6 + 8))(plVar6);
            cmMakefile::~cmMakefile((cmMakefile *)&msg_2);
            (*globalGenerator->_vptr_cmGlobalGenerator[1])(globalGenerator);
          }
        }
        products.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        products.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        products.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&msg_2,"CMAKE_MAKEFILE_PRODUCTS",(allocator<char> *)&dep_newest);
        pcVar5 = cmMakefile::GetDefinition(&mf,(string *)&msg_2);
        std::__cxx11::string::~string((string *)&msg_2);
        psVar8 = products.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        psVar9 = products.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pcVar5 != (char *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&msg_2,pcVar5,(allocator<char> *)&dep_newest);
          cmSystemTools::ExpandListArgument((string *)&msg_2,&products,false);
          std::__cxx11::string::~string((string *)&msg_2);
          psVar8 = products.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          psVar9 = products.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        for (; psVar8 != psVar9; psVar8 = psVar8 + 1) {
          bVar2 = cmsys::SystemTools::FileExists(psVar8);
          if ((!bVar2) && (bVar2 = cmsys::SystemTools::FileIsSymlink(psVar8), !bVar2)) {
            uVar7 = 1;
            if (bVar1) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg_2);
              poVar4 = std::operator<<((ostream *)&msg_2,"Re-run cmake, missing byproduct: ");
              poVar4 = std::operator<<(poVar4,(string *)psVar8);
              std::operator<<(poVar4,"\n");
              std::__cxx11::stringbuf::str();
              cmSystemTools::Stdout(&dep_newest);
              std::__cxx11::string::~string((string *)&dep_newest);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg_2);
            }
            goto LAB_001dc772;
          }
        }
        depends.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        depends.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        depends.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        outputs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        outputs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        outputs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&msg_2,"CMAKE_MAKEFILE_DEPENDS",(allocator<char> *)&dep_newest);
        pcVar5 = cmMakefile::GetDefinition(&mf,(string *)&msg_2);
        std::__cxx11::string::~string((string *)&msg_2);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&msg_2,"CMAKE_MAKEFILE_OUTPUTS",(allocator<char> *)&dep_newest);
        __s = cmMakefile::GetDefinition(&mf,(string *)&msg_2);
        std::__cxx11::string::~string((string *)&msg_2);
        if (__s != (char *)0x0 && pcVar5 != (char *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&msg_2,pcVar5,(allocator<char> *)&dep_newest);
          cmSystemTools::ExpandListArgument((string *)&msg_2,&depends,false);
          std::__cxx11::string::~string((string *)&msg_2);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&msg_2,__s,(allocator<char> *)&dep_newest);
          cmSystemTools::ExpandListArgument((string *)&msg_2,&outputs,false);
          std::__cxx11::string::~string((string *)&msg_2);
        }
        psVar9 = depends.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((depends.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             depends.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) ||
           (outputs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            outputs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          uVar7 = 1;
          if (bVar1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg_2);
            std::operator<<((ostream *)&msg_2,
                            "Re-run cmake no CMAKE_MAKEFILE_DEPENDS or CMAKE_MAKEFILE_OUTPUTS :\n");
            std::__cxx11::stringbuf::str();
            cmSystemTools::Stdout(&dep_newest);
            std::__cxx11::string::~string((string *)&dep_newest);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg_2);
          }
        }
        else {
          std::__cxx11::string::string
                    ((string *)&dep_newest,
                     (string *)
                     depends.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
          while (psVar8 = outputs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start, psVar9 = psVar9 + 1,
                psVar9 != depends.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) {
            result = 0;
            bVar2 = cmFileTimeCache::Compare(this->FileTimeCache,&dep_newest,psVar9,&result);
            if (!bVar2) {
              if (bVar1) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg_2);
                std::operator<<((ostream *)&msg_2,
                                "Re-run cmake: build system dependency is missing\n");
                std::__cxx11::stringbuf::str();
                cmSystemTools::Stdout(&out_oldest);
                std::__cxx11::string::~string((string *)&out_oldest);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg_2);
              }
              uVar7 = 1;
              goto LAB_001dc754;
            }
            if (result < 0) {
              std::__cxx11::string::_M_assign((string *)&dep_newest);
            }
          }
          std::__cxx11::string::string
                    ((string *)&out_oldest,
                     (string *)
                     outputs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
          while (psVar8 = psVar8 + 1,
                psVar8 != outputs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) {
            result_1 = 0;
            bVar2 = cmFileTimeCache::Compare(this->FileTimeCache,&out_oldest,psVar8,&result_1);
            if (!bVar2) {
              if (bVar1) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg_2);
                std::operator<<((ostream *)&msg_2,"Re-run cmake: build system output is missing\n");
                std::__cxx11::stringbuf::str();
                cmSystemTools::Stdout((string *)&result);
                std::__cxx11::string::~string((string *)&result);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg_2);
              }
              uVar7 = 1;
              goto LAB_001dc747;
            }
            if (0 < result_1) {
              std::__cxx11::string::_M_assign((string *)&out_oldest);
            }
          }
          result_1 = 0;
          bVar2 = cmFileTimeCache::Compare(this->FileTimeCache,&out_oldest,&dep_newest,&result_1);
          bVar10 = result_1 < 0;
          if (bVar1 && (!bVar2 || bVar10)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg_2);
            poVar4 = std::operator<<((ostream *)&msg_2,"Re-run cmake file: ");
            poVar4 = std::operator<<(poVar4,(string *)&out_oldest);
            poVar4 = std::operator<<(poVar4," older than: ");
            poVar4 = std::operator<<(poVar4,(string *)&dep_newest);
            std::operator<<(poVar4,"\n");
            std::__cxx11::stringbuf::str();
            cmSystemTools::Stdout((string *)&result);
            std::__cxx11::string::~string((string *)&result);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg_2);
          }
          uVar7 = (uint)(!bVar2 || bVar10);
LAB_001dc747:
          std::__cxx11::string::~string((string *)&out_oldest);
LAB_001dc754:
          std::__cxx11::string::~string((string *)&dep_newest);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&outputs);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&depends);
LAB_001dc772:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&products);
      }
      cmMakefile::~cmMakefile(&mf);
      cmGlobalGenerator::~cmGlobalGenerator(&gg);
      ~cmake(&cm);
      return uVar7;
    }
    if (!bVar1) {
      return 1;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&mf);
    poVar4 = std::operator<<((ostream *)&mf,"Re-run cmake missing file: ");
    poVar4 = std::operator<<(poVar4,(string *)psVar9);
    std::operator<<(poVar4,"\n");
    std::__cxx11::stringbuf::str();
    cmSystemTools::Stdout((string *)&msg_2);
  }
  std::__cxx11::string::~string((string *)&msg_2);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&mf);
  return 1;
}

Assistant:

int cmake::CheckBuildSystem()
{
  // We do not need to rerun CMake.  Check dependency integrity.
  const bool verbose = isCMakeVerbose();

  // This method will check the integrity of the build system if the
  // option was given on the command line.  It reads the given file to
  // determine whether CMake should rerun.

  // If no file is provided for the check, we have to rerun.
  if (this->CheckBuildSystemArgument.empty()) {
    if (verbose) {
      std::ostringstream msg;
      msg << "Re-run cmake no build system arguments\n";
      cmSystemTools::Stdout(msg.str());
    }
    return 1;
  }

  // If the file provided does not exist, we have to rerun.
  if (!cmSystemTools::FileExists(this->CheckBuildSystemArgument)) {
    if (verbose) {
      std::ostringstream msg;
      msg << "Re-run cmake missing file: " << this->CheckBuildSystemArgument
          << "\n";
      cmSystemTools::Stdout(msg.str());
    }
    return 1;
  }

  // Read the rerun check file and use it to decide whether to do the
  // global generate.
  // Actually, all we need is the `set` command.
  cmake cm(RoleScript, cmState::Unknown);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator gg(&cm);
  cmMakefile mf(&gg, cm.GetCurrentSnapshot());
  if (!mf.ReadListFile(this->CheckBuildSystemArgument) ||
      cmSystemTools::GetErrorOccuredFlag()) {
    if (verbose) {
      std::ostringstream msg;
      msg << "Re-run cmake error reading : " << this->CheckBuildSystemArgument
          << "\n";
      cmSystemTools::Stdout(msg.str());
    }
    // There was an error reading the file.  Just rerun.
    return 1;
  }

  if (this->ClearBuildSystem) {
    // Get the generator used for this build system.
    const char* genName = mf.GetDefinition("CMAKE_DEPENDS_GENERATOR");
    if (!genName || genName[0] == '\0') {
      genName = "Unix Makefiles";
    }

    // Create the generator and use it to clear the dependencies.
    std::unique_ptr<cmGlobalGenerator> ggd(
      this->CreateGlobalGenerator(genName));
    if (ggd) {
      cm.GetCurrentSnapshot().SetDefaultDefinitions();
      cmMakefile mfd(ggd.get(), cm.GetCurrentSnapshot());
      std::unique_ptr<cmLocalGenerator> lgd(ggd->CreateLocalGenerator(&mfd));
      lgd->ClearDependencies(&mfd, verbose);
    }
  }

  // If any byproduct of makefile generation is missing we must re-run.
  std::vector<std::string> products;
  if (const char* productStr = mf.GetDefinition("CMAKE_MAKEFILE_PRODUCTS")) {
    cmSystemTools::ExpandListArgument(productStr, products);
  }
  for (std::string const& p : products) {
    if (!(cmSystemTools::FileExists(p) || cmSystemTools::FileIsSymlink(p))) {
      if (verbose) {
        std::ostringstream msg;
        msg << "Re-run cmake, missing byproduct: " << p << "\n";
        cmSystemTools::Stdout(msg.str());
      }
      return 1;
    }
  }

  // Get the set of dependencies and outputs.
  std::vector<std::string> depends;
  std::vector<std::string> outputs;
  const char* dependsStr = mf.GetDefinition("CMAKE_MAKEFILE_DEPENDS");
  const char* outputsStr = mf.GetDefinition("CMAKE_MAKEFILE_OUTPUTS");
  if (dependsStr && outputsStr) {
    cmSystemTools::ExpandListArgument(dependsStr, depends);
    cmSystemTools::ExpandListArgument(outputsStr, outputs);
  }
  if (depends.empty() || outputs.empty()) {
    // Not enough information was provided to do the test.  Just rerun.
    if (verbose) {
      std::ostringstream msg;
      msg << "Re-run cmake no CMAKE_MAKEFILE_DEPENDS "
             "or CMAKE_MAKEFILE_OUTPUTS :\n";
      cmSystemTools::Stdout(msg.str());
    }
    return 1;
  }

  // Find the newest dependency.
  std::vector<std::string>::iterator dep = depends.begin();
  std::string dep_newest = *dep++;
  for (; dep != depends.end(); ++dep) {
    int result = 0;
    if (this->FileTimeCache->Compare(dep_newest, *dep, &result)) {
      if (result < 0) {
        dep_newest = *dep;
      }
    } else {
      if (verbose) {
        std::ostringstream msg;
        msg << "Re-run cmake: build system dependency is missing\n";
        cmSystemTools::Stdout(msg.str());
      }
      return 1;
    }
  }

  // Find the oldest output.
  std::vector<std::string>::iterator out = outputs.begin();
  std::string out_oldest = *out++;
  for (; out != outputs.end(); ++out) {
    int result = 0;
    if (this->FileTimeCache->Compare(out_oldest, *out, &result)) {
      if (result > 0) {
        out_oldest = *out;
      }
    } else {
      if (verbose) {
        std::ostringstream msg;
        msg << "Re-run cmake: build system output is missing\n";
        cmSystemTools::Stdout(msg.str());
      }
      return 1;
    }
  }

  // If any output is older than any dependency then rerun.
  {
    int result = 0;
    if (!this->FileTimeCache->Compare(out_oldest, dep_newest, &result) ||
        result < 0) {
      if (verbose) {
        std::ostringstream msg;
        msg << "Re-run cmake file: " << out_oldest
            << " older than: " << dep_newest << "\n";
        cmSystemTools::Stdout(msg.str());
      }
      return 1;
    }
  }

  // No need to rerun.
  return 0;
}